

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O0

void duckdb::ReadDataFromStructSegment
               (ListSegmentFunctions *functions,ListSegment *segment,Vector *result,
               idx_t *total_count)

{
  read_data_from_segment_t p_Var1;
  bool *pbVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *this;
  ListSegment **ppLVar3;
  size_type sVar4;
  const_data_ptr_t ptr;
  ListSegment *pLVar5;
  type pVVar6;
  idx_t *in_RCX;
  ushort *in_RSI;
  value_type *child_function;
  ListSegment *struct_children_segment;
  idx_t child_count;
  ListSegment **struct_children;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *children;
  idx_t i;
  bool *null_mask;
  ValidityMask *aggr_vector_validity;
  Vector *in_stack_ffffffffffffff78;
  const_reference in_stack_ffffffffffffff80;
  ulong local_50;
  ulong local_38;
  
  FlatVector::Validity((Vector *)0x2bb4b88);
  pbVar2 = GetNullMask((ListSegment *)0x2bb4b97);
  for (local_38 = 0; local_38 < *in_RSI; local_38 = local_38 + 1) {
    if ((pbVar2[local_38] & 1U) != 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff80,
                 (idx_t)in_stack_ffffffffffffff78);
    }
  }
  this = &StructVector::GetEntries(in_stack_ffffffffffffff78)->
          super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  ;
  ppLVar3 = GetStructData((ListSegment *)0x2bb4c09);
  local_50 = 0;
  while( true ) {
    sVar4 = ::std::
            vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
            ::size(this);
    if (sVar4 <= local_50) break;
    ptr = const_data_ptr_cast<const_duckdb::ListSegment_*>(ppLVar3 + local_50);
    pLVar5 = Load<duckdb::ListSegment_*>(ptr);
    in_stack_ffffffffffffff80 =
         vector<duckdb::ListSegmentFunctions,_true>::operator[]
                   ((vector<duckdb::ListSegmentFunctions,_true> *)in_stack_ffffffffffffff80,
                    (size_type)in_stack_ffffffffffffff78);
    p_Var1 = in_stack_ffffffffffffff80->read_data;
    vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>::
    operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_stack_ffffffffffffff80);
    (*p_Var1)(in_stack_ffffffffffffff80,pLVar5,pVVar6,in_RCX);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

static void ReadDataFromStructSegment(const ListSegmentFunctions &functions, const ListSegment *segment, Vector &result,
                                      idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto &children = StructVector::GetEntries(result);

	// recurse into the child segments of each child of the struct
	D_ASSERT(children.size() == functions.child_functions.size());
	auto struct_children = GetStructData(segment);
	for (idx_t child_count = 0; child_count < children.size(); child_count++) {
		auto struct_children_segment = Load<ListSegment *>(const_data_ptr_cast(struct_children + child_count));
		auto &child_function = functions.child_functions[child_count];
		child_function.read_data(child_function, struct_children_segment, *children[child_count], total_count);
	}
}